

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void xclass_cb(Fl_Input *i,void *v)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  Fl_Widget_Type *w;
  Fl_Widget_Type *this;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    pp_Var1 = (i->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget;
    if (iVar3 != 0) {
      (*pp_Var1[5])();
      (*(((i->super_Fl_Input_).super_Fl_Widget.parent_)->super_Fl_Widget)._vptr_Fl_Widget[5])();
      Fl_Input_::value(&i->super_Fl_Input_,current_widget->xclass);
      return;
    }
    (*pp_Var1[6])(i);
    (*(((i->super_Fl_Input_).super_Fl_Widget.parent_)->super_Fl_Widget)._vptr_Fl_Widget[6])();
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar2 = false;
    this = (Fl_Widget_Type *)Fl_Type::first;
    do {
      if ((this->super_Fl_Type).selected != '\0') {
        iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
        if (iVar3 != 0) {
          iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
          if (iVar3 == 0) {
            iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
            if (iVar3 != 0) goto LAB_0018d501;
          }
          else {
LAB_0018d501:
            storestring((i->super_Fl_Input_).value_,&this->xclass,0);
          }
          iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
          if (iVar3 == 0) {
            iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])(this);
            bVar2 = true;
            if (iVar3 != 0) {
              Fl_Widget_Type::redraw(this);
            }
          }
          else {
            Fl_Window::xclass((Fl_Window *)this->o,this->xclass);
            bVar2 = true;
          }
        }
      }
      this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
    } while (this != (Fl_Widget_Type *)0x0);
    if (bVar2) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void xclass_cb(Fl_Input* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) {
      i->hide(); 
      i->parent()->hide(); // hides the "X Class:" label as well
      return;
    }
    i->show();
    i->parent()->show();
    i->value(((Fl_Widget_Type *)current_widget)->xclass);
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        mod = 1;
	Fl_Widget_Type* w = (Fl_Widget_Type*)o;
	if (w->is_window() || w->is_button())
	  storestring(i->value(),w->xclass);
	if (w->is_window()) ((Fl_Window*)(w->o))->xclass(w->xclass);
	else if (w->is_menu_item()) w->redraw();
      }
    }
    if (mod) set_modflag(1);
  }
}